

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

void Assimp::PLYImporter::GetMaterialColor
               (vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                *avList,uint *aiPositions,EDataType *aiTypes,aiColor4D *clrOut)

{
  PropertyInstance *pPVar1;
  const_reference pvVar2;
  ai_real aVar3;
  aiColor4D *clrOut_local;
  EDataType *aiTypes_local;
  uint *aiPositions_local;
  vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
  *avList_local;
  
  if (clrOut != (aiColor4D *)0x0) {
    if (*aiPositions == 0xffffffff) {
      clrOut->r = 0.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_7c999a::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,*aiPositions);
      pvVar2 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar1->avList);
      aVar3 = NormalizeColorValue(*pvVar2,*aiTypes);
      clrOut->r = aVar3;
    }
    if (aiPositions[1] == 0xffffffff) {
      clrOut->g = 0.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_7c999a::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[1]);
      pvVar2 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar1->avList);
      aVar3 = NormalizeColorValue(*pvVar2,aiTypes[1]);
      clrOut->g = aVar3;
    }
    if (aiPositions[2] == 0xffffffff) {
      clrOut->b = 0.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_7c999a::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[2]);
      pvVar2 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar1->avList);
      aVar3 = NormalizeColorValue(*pvVar2,aiTypes[2]);
      clrOut->b = aVar3;
    }
    if (aiPositions[3] == 0xffffffff) {
      clrOut->a = 1.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_7c999a::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[3]);
      pvVar2 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar1->avList);
      aVar3 = NormalizeColorValue(*pvVar2,aiTypes[3]);
      clrOut->a = aVar3;
    }
    return;
  }
  __assert_fail("__null != clrOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                ,0x2b2,
                "static void Assimp::PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance> &, unsigned int *, PLY::EDataType *, aiColor4D *)"
               );
}

Assistant:

void PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance>& avList,
  unsigned int aiPositions[4],
  PLY::EDataType aiTypes[4],
  aiColor4D* clrOut)
{
  ai_assert(NULL != clrOut);

  if (0xFFFFFFFF == aiPositions[0])clrOut->r = 0.0f;
  else
  {
    clrOut->r = NormalizeColorValue(GetProperty(avList,
      aiPositions[0]).avList.front(), aiTypes[0]);
  }

  if (0xFFFFFFFF == aiPositions[1])clrOut->g = 0.0f;
  else
  {
    clrOut->g = NormalizeColorValue(GetProperty(avList,
      aiPositions[1]).avList.front(), aiTypes[1]);
  }

  if (0xFFFFFFFF == aiPositions[2])clrOut->b = 0.0f;
  else
  {
    clrOut->b = NormalizeColorValue(GetProperty(avList,
      aiPositions[2]).avList.front(), aiTypes[2]);
  }

  // assume 1.0 for the alpha channel ifit is not set
  if (0xFFFFFFFF == aiPositions[3])clrOut->a = 1.0f;
  else
  {
    clrOut->a = NormalizeColorValue(GetProperty(avList,
      aiPositions[3]).avList.front(), aiTypes[3]);
  }
}